

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::ATMOS::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  ILogSink *pIVar4;
  undefined1 local_250 [104];
  undefined1 local_1e8 [112];
  InterchangeObject *iObj_1;
  undefined1 local_170 [104];
  undefined1 local_108 [104];
  byte_t *local_a0;
  InterchangeObject *iObj;
  undefined1 local_88 [8];
  Result_t result;
  string *filename_local;
  h__Reader *this_local;
  
  h__ASDCPReader::OpenMXFRead((h__ASDCPReader *)local_88,filename);
  *(undefined8 *)((long)&filename[0x32].field_2 + 8) = 0;
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    local_a0 = (byte_t *)0x0;
    pMVar3 = Dictionary::Type((Dictionary *)filename->_M_string_length,MDD_PrivateDCDataDescriptor);
    MXF::OP1aHeader::GetMDObjectByType
              ((OP1aHeader *)local_108,(byte_t *)((filename->field_2)._M_local_buf + 8),
               (InterchangeObject **)pMVar3);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)local_108);
    Kumu::Result_t::~Result_t((Result_t *)local_108);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
    if (-1 < iVar2) {
      *(byte_t **)((long)&filename[0x32].field_2 + 8) = local_a0;
    }
  }
  if (*(long *)((long)&filename[0x32].field_2 + 8) == 0) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"DCDataDescriptor object not found in Atmos file.\n");
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    MD_to_DCData_DDesc((h__Reader *)local_170,(DCDataDescriptor *)filename);
    Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)local_170);
    Kumu::Result_t::~Result_t((Result_t *)local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (((((iVar2 < 0) ||
        (bVar1 = Rational::operator!=
                           ((Rational *)&filename[0x33]._M_string_length,
                            (Rational *)&ASDCP::EditRate_24), !bVar1)) ||
       (bVar1 = Rational::operator!=
                          ((Rational *)&filename[0x33]._M_string_length,
                           (Rational *)&ASDCP::EditRate_25), !bVar1)) ||
      (((bVar1 = Rational::operator!=
                           ((Rational *)&filename[0x33]._M_string_length,
                            (Rational *)&ASDCP::EditRate_30), !bVar1 ||
        (bVar1 = Rational::operator!=
                           ((Rational *)&filename[0x33]._M_string_length,
                            (Rational *)&ASDCP::EditRate_48), !bVar1)) ||
       ((bVar1 = Rational::operator!=
                           ((Rational *)&filename[0x33]._M_string_length,
                            (Rational *)&ASDCP::EditRate_50), !bVar1 ||
        ((bVar1 = Rational::operator!=
                            ((Rational *)&filename[0x33]._M_string_length,
                             (Rational *)&ASDCP::EditRate_60), !bVar1 ||
         (bVar1 = Rational::operator!=
                            ((Rational *)&filename[0x33]._M_string_length,
                             (Rational *)&ASDCP::EditRate_96), !bVar1)))))))) ||
     ((bVar1 = Rational::operator!=
                         ((Rational *)&filename[0x33]._M_string_length,
                          (Rational *)&ASDCP::EditRate_100), !bVar1 ||
      ((((bVar1 = Rational::operator!=
                            ((Rational *)&filename[0x33]._M_string_length,
                             (Rational *)&ASDCP::EditRate_120), !bVar1 ||
         (bVar1 = Rational::operator!=
                            ((Rational *)&filename[0x33]._M_string_length,
                             (Rational *)&ASDCP::EditRate_192), !bVar1)) ||
        (bVar1 = Rational::operator!=
                           ((Rational *)&filename[0x33]._M_string_length,
                            (Rational *)&ASDCP::EditRate_200), !bVar1)) ||
       (bVar1 = Rational::operator!=
                          ((Rational *)&filename[0x33]._M_string_length,
                           (Rational *)&ASDCP::EditRate_240), !bVar1)))))) {
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
    if (-1 < iVar2) {
      if (*(long *)(filename + 0x33) == 0) {
        local_1e8._104_8_ = 0;
        pMVar3 = Dictionary::Type((Dictionary *)filename->_M_string_length,
                                  MDD_DolbyAtmosSubDescriptor);
        MXF::OP1aHeader::GetMDObjectByType
                  ((OP1aHeader *)local_1e8,(byte_t *)((filename->field_2)._M_local_buf + 8),
                   (InterchangeObject **)pMVar3);
        Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)local_1e8);
        Kumu::Result_t::~Result_t((Result_t *)local_1e8);
        *(undefined8 *)(filename + 0x33) = local_1e8._104_8_;
        if (local_1e8._104_8_ == 0) {
          pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar4,"DolbyAtmosSubDescriptor object not found.\n");
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
          goto LAB_002bd3c2;
        }
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
      if (-1 < iVar2) {
        MD_to_Atmos_ADesc((h__Reader *)local_250,(AtmosDescriptor *)filename);
        Kumu::Result_t::operator=((Result_t *)local_88,(Result_t *)local_250);
        Kumu::Result_t::~Result_t((Result_t *)local_250);
      }
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
  }
  else {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar4,"DC Data file EditRate is not a supported value: %d/%d\n",
               (ulong)(uint)filename[0x33]._M_string_length,
               (ulong)*(uint *)((long)&filename[0x33]._M_string_length + 4));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
LAB_002bd3c2:
  iObj_1._4_4_ = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);
  m_EssenceDescriptor = 0;

  if ( KM_SUCCESS(result) )
    {
      InterchangeObject* iObj = 0;
      result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(PrivateDCDataDescriptor), &iObj);

      if ( KM_SUCCESS(result) )
	{
	  m_EssenceDescriptor = static_cast<MXF::PrivateDCDataDescriptor*>(iObj);
	}
    }

  if ( m_EssenceDescriptor == 0 )
    {
      DefaultLogSink().Error("DCDataDescriptor object not found in Atmos file.\n");
      result = RESULT_FORMAT;
    }

  if ( KM_SUCCESS(result) )
    {
      result = MD_to_DCData_DDesc(m_DDesc);
    }

  // check for sample/frame rate sanity
  if ( ASDCP_SUCCESS(result)
       && m_DDesc.EditRate != EditRate_24
       && m_DDesc.EditRate != EditRate_25
       && m_DDesc.EditRate != EditRate_30
       && m_DDesc.EditRate != EditRate_48
       && m_DDesc.EditRate != EditRate_50
       && m_DDesc.EditRate != EditRate_60
       && m_DDesc.EditRate != EditRate_96
       && m_DDesc.EditRate != EditRate_100
       && m_DDesc.EditRate != EditRate_120
       && m_DDesc.EditRate != EditRate_192
       && m_DDesc.EditRate != EditRate_200
       && m_DDesc.EditRate != EditRate_240 )
  {
    DefaultLogSink().Error("DC Data file EditRate is not a supported value: %d/%d\n", // lu
                           m_DDesc.EditRate.Numerator, m_DDesc.EditRate.Denominator);

    return RESULT_FORMAT;
  }

  if( ASDCP_SUCCESS(result) )
    {
      
      if (NULL == m_EssenceSubDescriptor)
	{
	  InterchangeObject* iObj = NULL;
	  result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(DolbyAtmosSubDescriptor), &iObj);
	  m_EssenceSubDescriptor = static_cast<MXF::DolbyAtmosSubDescriptor*>(iObj);
	  
	  if ( iObj == 0 )
	    {
	      DefaultLogSink().Error("DolbyAtmosSubDescriptor object not found.\n");
	      return RESULT_FORMAT;
	    }
	}

      if ( ASDCP_SUCCESS(result) )
	{
	  result = MD_to_Atmos_ADesc(m_ADesc);
	}
    }

  return result;
}